

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdot.cpp
# Opt level: O0

double dot(int n,block_q4_0 *x,float *y)

{
  uint uVar1;
  uint uVar2;
  int k;
  float s;
  uint32_t *u;
  float d;
  int i;
  double sum;
  uint8_t *q2;
  uint8_t *q1;
  uint32_t u2;
  uint32_t u1;
  uint32_t kMask1;
  float *y_local;
  block_q4_0 *x_local;
  int n_local;
  
  sum = 0.0;
  y_local = y;
  x_local = x;
  for (i = 0; i < n; i = i + 1) {
    s = 0.0;
    for (k = 0; k < 4; k = k + 1) {
      uVar1 = *(uint *)(x_local->qs + (long)k * 4) & 0xf0f0f0f;
      uVar2 = *(uint *)(x_local->qs + (long)k * 4) >> 4 & 0xf0f0f0f;
      u1._0_1_ = (byte)uVar1;
      u2._0_1_ = (byte)uVar2;
      u1._1_1_ = (byte)(uVar1 >> 8);
      u2._1_1_ = (byte)(uVar2 >> 8);
      u1._2_1_ = (byte)(uVar1 >> 0x10);
      u2._2_1_ = (byte)(uVar2 >> 0x10);
      u1._3_1_ = (byte)(uVar1 >> 0x18);
      u2._3_1_ = (byte)(uVar2 >> 0x18);
      s = y_local[7] * dot::kValues[u2._3_1_] +
          y_local[6] * dot::kValues[u1._3_1_] +
          y_local[5] * dot::kValues[u2._2_1_] +
          y_local[4] * dot::kValues[u1._2_1_] +
          y_local[3] * dot::kValues[u2._1_1_] +
          y_local[2] * dot::kValues[u1._1_1_] +
          *y_local * dot::kValues[(byte)u1] + y_local[1] * dot::kValues[(byte)u2] + s;
      y_local = y_local + 8;
    }
    sum = (double)(s * x_local->d) + sum;
    x_local = x_local + 1;
  }
  return sum;
}

Assistant:

inline double dot(int n, const block_q4_0* x, const float* y) {
    const static float kValues[16] = {-8.f, -7.f, -6.f, -5.f, -4.f, -3.f, -2.f, -1.f, 0.f, 1.f, 2.f, 3.f, 4.f, 5.f, 6.f, 7.f};
    constexpr uint32_t kMask1 = 0x0f0f0f0f;
    uint32_t u1, u2;
    auto q1 = (const uint8_t*)&u1;
    auto q2 = (const uint8_t*)&u2;
    double sum = 0;
    for (int i=0; i<n; ++i) {
        float d = x->d;
        auto u = (const uint32_t*)x->qs;
        float s = 0;
        for (int k=0; k<4; ++k) {
            u1 = u[k] & kMask1;
            u2 = (u[k] >> 4) & kMask1;
            s += y[0]*kValues[q1[0]] + y[1]*kValues[q2[0]] +
                 y[2]*kValues[q1[1]] + y[3]*kValues[q2[1]] +
                 y[4]*kValues[q1[2]] + y[5]*kValues[q2[2]] +
                 y[6]*kValues[q1[3]] + y[7]*kValues[q2[3]];
            y += 8;
        }
        sum += s*d;
        ++x;
    }
    return sum;
}